

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O1

bool __thiscall
OpenCLEnum::queryPlatformInfo
          (OpenCLEnum *this,cl_platform_id platform_id,uint param,string *value,string *param_name,
          size_t max_size)

{
  pointer pcVar1;
  char *__s;
  char *pcVar2;
  uint uVar3;
  ostream *poVar4;
  cl_int code;
  vector<char,_std::allocator<char>_> data;
  size_t local_70;
  string local_68;
  vector<char,_std::allocator<char>_> local_48;
  
  local_70 = max_size;
  std::vector<char,_std::allocator<char>_>::vector(&local_48,max_size,(allocator_type *)&local_68);
  uVar3 = clGetPlatformInfo(platform_id,param,local_70,
                            local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,&local_70);
  if (uVar3 == 0) {
    pcVar1 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)value,pcVar1,pcVar1 + value->_M_string_length,
               local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + local_70);
    __s = (value->_M_dataplus)._M_p;
    pcVar2 = (char *)value->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)__s);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"clGetPlatformInfo(",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(param_name->_M_dataplus)._M_p,
                        param_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") failed: ",10);
    ocl::errorString_abi_cxx11_(&local_68,(ocl *)(ulong)uVar3,code);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar3 == 0;
}

Assistant:

bool OpenCLEnum::queryPlatformInfo(cl_platform_id platform_id, unsigned int param, std::string &value, const std::string &param_name, size_t max_size)
{
	cl_int res;

	std::vector<char> data(max_size);
	res = clGetPlatformInfo(platform_id, param, max_size, data.data(), &max_size);
	if (res != CL_SUCCESS) {
		std::cerr << "clGetPlatformInfo(" << param_name << ") failed: " << ocl::errorString(res) << std::endl;
		return false;
	}

	value.assign(data.begin(), data.begin() + max_size);
	value = value.c_str();	// remove trailing null chars
	return true;
}